

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

SpecialProperties Catch::anon_unknown_1::parseSpecialTag(string *tag)

{
  bool bVar1;
  string *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  char in_stack_ffffffffffffffef;
  
  bVar1 = startsWith(in_RDI,in_stack_ffffffffffffffef);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                      in_stack_ffffffffffffffe8)), bVar1)) {
    return IsHidden;
  }
  bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                  in_stack_ffffffffffffffe8));
  if (bVar1) {
    return Throws;
  }
  bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                  in_stack_ffffffffffffffe8));
  if (!bVar1) {
    bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                    in_stack_ffffffffffffffe8));
    if (bVar1) {
      return MayFail;
    }
    bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                    in_stack_ffffffffffffffe8));
    if (!bVar1) {
      bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef,
                                                      in_stack_ffffffffffffffe8));
      if (!bVar1) {
        return None;
      }
      return Benchmark|IsHidden;
    }
    return NonPortable;
  }
  return ShouldFail;
}

Assistant:

TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
            if( startsWith( tag, '.' ) ||
                tag == "!hide" )
                return TestCaseInfo::IsHidden;
            else if( tag == "!throws" )
                return TestCaseInfo::Throws;
            else if( tag == "!shouldfail" )
                return TestCaseInfo::ShouldFail;
            else if( tag == "!mayfail" )
                return TestCaseInfo::MayFail;
            else if( tag == "!nonportable" )
                return TestCaseInfo::NonPortable;
            else if( tag == "!benchmark" )
                return static_cast<TestCaseInfo::SpecialProperties>( TestCaseInfo::Benchmark | TestCaseInfo::IsHidden );
            else
                return TestCaseInfo::None;
        }